

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callable.hpp
# Opt level: O2

void __thiscall tmf::empty_callable::empty_callable(empty_callable *this,string *what)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"[empty_callable]: ",what);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_00106d50;
  return;
}

Assistant:

empty_callable(const std::string& what)
    : std::runtime_error("[empty_callable]: " + what)
  {}